

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Shop::printSale(Shop *this,Sale *sale)

{
  ostream *poVar1;
  Medicine medicine;
  Medicine MStack_a8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Customer Name",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Medicine Name",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Medicine Company",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quantity",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Unit Price",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Amount",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Date",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  Medicine::Medicine(&MStack_a8,&sale->medicine);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sale->id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(sale->customerName)._M_dataplus._M_p,
                      (sale->customerName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,MStack_a8.name._M_dataplus._M_p,MStack_a8.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,MStack_a8.companyName._M_dataplus._M_p,
                      MStack_a8.companyName._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sale->quantity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,MStack_a8.unitePrice);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sale->quantity * (sale->medicine).unitePrice);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(sale->date)._M_dataplus._M_p,(sale->date)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)MStack_a8.expireDate._M_dataplus._M_p != &MStack_a8.expireDate.field_2) {
    operator_delete(MStack_a8.expireDate._M_dataplus._M_p,
                    MStack_a8.expireDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)MStack_a8.arrivalDate._M_dataplus._M_p != &MStack_a8.arrivalDate.field_2) {
    operator_delete(MStack_a8.arrivalDate._M_dataplus._M_p,
                    MStack_a8.arrivalDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)MStack_a8.companyName._M_dataplus._M_p != &MStack_a8.companyName.field_2) {
    operator_delete(MStack_a8.companyName._M_dataplus._M_p,
                    MStack_a8.companyName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)MStack_a8.name._M_dataplus._M_p != &MStack_a8.name.field_2) {
    operator_delete(MStack_a8.name._M_dataplus._M_p,MStack_a8.name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void printSale(Sale sale) {
        cout << "ID" << "\t" << "Customer Name" << "\t" << "Medicine Name" << "\t" << "Medicine Company" << "\t"
             << "Quantity" << "\t" << "Unit Price" << "\t" << "Total Amount" << "\t" << "Date" << endl;
        Medicine medicine = sale.medicine;
        cout << sale.id << "\t" << sale.customerName << "\t" << medicine.getName() << "\t" << medicine.getCompanyName()
             << "\t" << sale.quantity << "\t" << medicine.unitePrice << "\t" << sale.getTotalAmount() << "\t"
             << sale.getDate() << endl;
    }